

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O1

void __thiscall
embree::VelvetMaterial::VelvetMaterial
          (VelvetMaterial *this,Vec3fa *reflectance,float backScattering,
          Vec3fa *horizonScatteringColor,float horizonScatteringFallOff)

{
  undefined8 uVar1;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  SceneGraph::Node::Node((Node *)this,&local_48);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002cc7f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002ccd18;
  (this->base).type = 3;
  uVar1 = *(undefined8 *)((long)&reflectance->field_0 + 8);
  *(undefined8 *)&(this->reflectance).field_0 = *(undefined8 *)&reflectance->field_0;
  *(undefined8 *)((long)&(this->reflectance).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&horizonScatteringColor->field_0 + 8);
  *(undefined8 *)&(this->horizonScatteringColor).field_0 =
       *(undefined8 *)&horizonScatteringColor->field_0;
  *(undefined8 *)((long)&(this->horizonScatteringColor).field_0 + 8) = uVar1;
  this->backScattering = backScattering;
  this->horizonScatteringFallOff = horizonScatteringFallOff;
  return;
}

Assistant:

VelvetMaterial (const Vec3fa& reflectance, const float backScattering, const Vec3fa& horizonScatteringColor, const float horizonScatteringFallOff)
      : base(MATERIAL_VELVET), reflectance(reflectance), horizonScatteringColor(horizonScatteringColor), backScattering(backScattering), horizonScatteringFallOff(horizonScatteringFallOff) {}